

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

DoubleComplex *
gai_get_armci_memory(Integer Ichunk,Integer Jchunk,Integer Kchunk,short nbuf,Integer atype)

{
  short in_CX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  double dVar1;
  Integer elems;
  DoubleComplex *tmp;
  DoubleComplex *local_30;
  
  local_30 = (DoubleComplex *)0x0;
  dVar1 = pow(1024.0,2.0);
  if ((long)((double)(int)in_CX * (double)(in_RDI * in_RDX) +
             (double)(int)in_CX * (double)(in_RDX * in_RSI) + (double)(in_RDI * in_RSI)) <
      (long)((long)in_CX * (long)dVar1 * 2 + (long)dVar1 +
            (ulong)((long)(in_CX * 3) << 4) / *(ulong *)(&DWORD_0028c718 + in_R8 * 4))) {
    local_30 = (DoubleComplex *)ARMCI_Malloc_local(0x14c44c);
  }
  return local_30;
}

Assistant:

static DoubleComplex* 
gai_get_armci_memory(Integer Ichunk, Integer Jchunk, Integer Kchunk,
		     short int nbuf, Integer atype) {

    DoubleComplex *tmp = NULL;
    Integer elems;

    elems = (Integer) pow((double)BLOCK_SIZE,(double)2);
    elems = nbuf*elems + nbuf*elems + elems; /* A,B,C temporary buffers */
    
    /* add extra elements for safety */
    elems += nbuf*NUM_MATS*sizeof(DoubleComplex)/GAsizeofM(atype);

    /* allocate temporary storage using ARMCI_Malloc */
    if( (Integer) (((double)nbuf)*(Ichunk* Kchunk) + 
		   ((double)nbuf)*(Kchunk* Jchunk) + 
		   Ichunk* Jchunk ) < elems) {
       tmp=(DoubleComplex*)ARMCI_Malloc_local(elems*GAsizeofM(atype));
    }
    return tmp;
}